

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O3

_List_iterator<Diligent::Parsing::HLSLTokenInfo>
Diligent::Parsing::FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
          (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *Start,
          _List_iterator<Diligent::Parsing::HLSLTokenInfo> *End,
          _List_iterator<Diligent::Parsing::HLSLTokenInfo> Pos)

{
  int iVar1;
  _List_node_base *p_Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  string msg;
  string local_30;
  
  p_Var2 = End->_M_node;
  if (p_Var2 == Pos._M_node) {
    return (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)Pos._M_node;
  }
  iVar1 = *(int *)&Pos._M_node[1]._M_next;
  switch(iVar1) {
  case 0x133:
    iVar4 = 0x134;
    break;
  case 0x134:
    iVar4 = 0x133;
    goto LAB_00206dcd;
  case 0x135:
    iVar4 = 0x136;
    break;
  case 0x136:
    iVar4 = 0x135;
    goto LAB_00206dcd;
  case 0x137:
    iVar4 = 0x138;
    break;
  case 0x138:
    iVar4 = 0x137;
    goto LAB_00206dcd;
  case 0x139:
    iVar4 = 0x13a;
    break;
  case 0x13a:
    iVar4 = 0x139;
LAB_00206dcd:
    iVar5 = 1;
    do {
      Pos._M_node = (Pos._M_node)->_M_prev;
      if (Pos._M_node == Start->_M_node) {
        return (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)p_Var2;
      }
      iVar3 = -(uint)(iVar4 == *(int *)&Pos._M_node[1]._M_next);
      if (iVar1 == *(int *)&Pos._M_node[1]._M_next) {
        iVar3 = 1;
      }
      iVar5 = iVar5 + iVar3;
    } while (iVar5 != 0);
    return (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)Pos._M_node;
  default:
    FormatString<char[37]>(&local_30,(char (*) [37])"One of the bracket types is expected");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"FindMatchingBracket",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
               ,0x3c5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) {
      return (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)Pos._M_node;
    }
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    return (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)Pos._M_node;
  }
  iVar5 = 1;
  do {
    Pos._M_node = (Pos._M_node)->_M_next;
    if (Pos._M_node == p_Var2) {
      return (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)p_Var2;
    }
    iVar3 = -(uint)(iVar4 == *(int *)&Pos._M_node[1]._M_next);
    if (iVar1 == *(int *)&Pos._M_node[1]._M_next) {
      iVar3 = 1;
    }
    iVar5 = iVar5 + iVar3;
  } while (iVar5 != 0);
  return (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)Pos._M_node;
}

Assistant:

TokenIterType FindMatchingBracket(const TokenIterType& Start,
                                  const TokenIterType& End,
                                  TokenIterType        Pos)
{
    if (Pos == End)
        return Pos;

    const auto OpenBracketType = Pos->GetType();
    using TokenType            = decltype(OpenBracketType);

    auto ClosingBracketType = TokenType::Undefined;
    bool SearchForward      = true;
    switch (OpenBracketType)
    {
        case TokenType::OpenBrace:
            ClosingBracketType = TokenType::ClosingBrace;
            break;

        case TokenType::OpenParen:
            ClosingBracketType = TokenType::ClosingParen;
            break;

        case TokenType::OpenSquareBracket:
            ClosingBracketType = TokenType::ClosingSquareBracket;
            break;

        case TokenType::OpenAngleBracket:
            ClosingBracketType = TokenType::ClosingAngleBracket;
            break;

        case TokenType::ClosingBrace:
            ClosingBracketType = TokenType::OpenBrace;
            SearchForward      = false;
            break;

        case TokenType::ClosingParen:
            ClosingBracketType = TokenType::OpenParen;
            SearchForward      = false;
            break;

        case TokenType::ClosingSquareBracket:
            ClosingBracketType = TokenType::OpenSquareBracket;
            SearchForward      = false;
            break;

        case TokenType::ClosingAngleBracket:
            ClosingBracketType = TokenType::OpenAngleBracket;
            SearchForward      = false;
            break;

        default:
            UNEXPECTED("One of the bracket types is expected");
            return Pos;
    }

    (SearchForward ? ++Pos : --Pos); // Skip open bracket
    int BracketCount = 1;

    auto UpdateBracketCount = [&](TokenType Type) //
    {
        if (Type == OpenBracketType)
            ++BracketCount;
        else if (Type == ClosingBracketType)
        {
            --BracketCount;
        }
        return BracketCount;
    };
    if (SearchForward)
    {
        while (Pos != End)
        {
            if (UpdateBracketCount(Pos->GetType()) == 0)
                return Pos;
            ++Pos;
        }
    }
    else
    {
        while (Pos != Start)
        {
            if (UpdateBracketCount(Pos->GetType()) == 0)
                return Pos;
            --Pos;
        }
    }
    return End;
}